

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InputFloat(char *label,float *v,float step,float step_fast,int decimal_precision,
                      ImGuiInputTextFlags flags)

{
  bool bVar1;
  char local_38 [8];
  char format [16];
  ImGuiInputTextFlags flags_local;
  int decimal_precision_local;
  float step_fast_local;
  float step_local;
  float *v_local;
  char *label_local;
  
  local_38[0] = '%';
  local_38[1] = 'f';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  format[0] = '\0';
  format[1] = '\0';
  format[2] = '\0';
  format[3] = '\0';
  format[4] = '\0';
  format[5] = '\0';
  format[6] = '\0';
  format[7] = '\0';
  format._8_4_ = flags;
  format._12_4_ = decimal_precision;
  if (-1 < decimal_precision) {
    ImFormatString(local_38,0x10,"%%.%df",(ulong)(uint)decimal_precision);
  }
  bVar1 = InputFloat(label,v,step,step_fast,local_38,format._8_4_);
  return bVar1;
}

Assistant:

bool ImGui::InputFloat(const char* label, float* v, float step, float step_fast, int decimal_precision, ImGuiInputTextFlags flags)
{
    char format[16] = "%f";
    if (decimal_precision >= 0)
        ImFormatString(format, IM_ARRAYSIZE(format), "%%.%df", decimal_precision);
    return InputFloat(label, v, step, step_fast, format, flags);
}